

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChExtruderBeamIGA::ChExtruderBeamIGA
          (ChExtruderBeamIGA *this,ChSystem *msystem,shared_ptr<chrono::fea::ChMesh> *mmesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,double mh,ChCoordsys<double> *moutlet
          ,double mspeed,int morder)

{
  ChCoordsys<double> *mc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChSystem *pCVar3;
  ChMesh *this_01;
  iterator iVar4;
  element_type *peVar5;
  element_type *peVar6;
  ChLinkMotorLinearSpeed *this_02;
  element_type *peVar7;
  _func_int **pp_Var8;
  int iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ChBody *this_03;
  ChNodeFEAxyzrot *this_04;
  ChLog *this_05;
  ChStreamOutAscii *pCVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  ChCoordsys<double> *size;
  int iVar11;
  undefined1 auVar12 [32];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeA;
  value_type local_388;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_370;
  ChBodyFrame *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_360;
  undefined1 *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  shared_ptr<chrono::ChPhysicsItem> local_348;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_338;
  shared_ptr<chrono::ChPhysicsItem> local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_308;
  double local_300;
  shared_ptr<chrono::ChFunction> local_2f8;
  ChFrame<double> local_2e8;
  ChFrame<double> local_258;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  mc = &this->outlet;
  (this->outlet).pos.m_data[2] = 0.0;
  (this->outlet).pos.m_data[0] = 0.0;
  (this->outlet).pos.m_data[1] = 0.0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar12 = ZEXT432(0) << 0x40;
  this->ground = (shared_ptr<chrono::ChBody>)auVar12._0_16_;
  this->actuator = (shared_ptr<chrono::ChLinkMotorLinearSpeed>)auVar12._16_16_;
  this->actuator = (shared_ptr<chrono::ChLinkMotorLinearSpeed>)auVar12._0_16_;
  this->guide = (shared_ptr<chrono::ChLinkMateGeneric>)auVar12._16_16_;
  auVar12 = ZEXT432(0) << 0x40;
  this->mesh = (shared_ptr<chrono::fea::ChMesh>)auVar12._0_16_;
  this->beam_section = (shared_ptr<chrono::fea::ChBeamSectionCosserat>)auVar12._16_16_;
  (this->outlet).rot.m_data[0] = 1.0;
  (this->outlet).rot.m_data[1] = 0.0;
  (this->outlet).rot.m_data[2] = 0.0;
  (this->outlet).rot.m_data[3] = 0.0;
  this->contact_material = (shared_ptr<chrono::ChMaterialSurfaceSMC>)auVar12._0_16_;
  this->contactcloud = (shared_ptr<chrono::fea::ChContactSurfaceNodeCloud>)auVar12._16_16_;
  this->beam_order = morder;
  this->h = mh;
  if (mc != moutlet) {
    (this->outlet).pos.m_data[0] = (moutlet->pos).m_data[0];
    (this->outlet).pos.m_data[1] = (moutlet->pos).m_data[1];
    (this->outlet).pos.m_data[2] = (moutlet->pos).m_data[2];
    (this->outlet).rot.m_data[0] = (moutlet->rot).m_data[0];
    (this->outlet).rot.m_data[1] = (moutlet->rot).m_data[1];
    (this->outlet).rot.m_data[2] = (moutlet->rot).m_data[2];
    (this->outlet).rot.m_data[3] = (moutlet->rot).m_data[3];
  }
  this->mysystem = msystem;
  local_370 = &this->beam_nodes;
  this_00 = &(this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mmesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_300 = mspeed;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&(mmesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
  local_310 = &(this->beam_section).
               super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  __r = &(sect->super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount;
  (this->beam_section).
  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sect->super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_310,__r);
  this->mytime = 0.0;
  this->speed = local_300;
  local_308 = this_00;
  this_03 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)__r);
  ChBody::ChBody(this_03,BULLET);
  local_2e8._vptr_ChFrame = (_func_int **)this_03;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8.coord,this_03);
  dVar1 = local_2e8.coord.pos.m_data[0];
  pp_Var8 = local_2e8._vptr_ChFrame;
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  local_2e8.coord.pos.m_data[0] = 0.0;
  p_Var2 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pp_Var8;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar1;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0]);
    }
  }
  ChBody::SetBodyFixed
            ((this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             true);
  local_328.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChPhysicsItem;
  local_328.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  pCVar3 = this->mysystem;
  p_Var2 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  ChSystem::Add(pCVar3,&local_328);
  if (local_328.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  size = mc;
  ChFrame<double>::ChFrame(&local_258,mc);
  this_04 = (ChNodeFEAxyzrot *)ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)size);
  local_2e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_2e8.coord.pos.m_data[0] = local_258.coord.pos.m_data[0];
  local_2e8.coord.pos.m_data[1] = local_258.coord.pos.m_data[1];
  local_2e8.coord.pos.m_data[2] = local_258.coord.pos.m_data[2];
  local_2e8.coord.rot.m_data[0] = local_258.coord.rot.m_data[0];
  local_2e8.coord.rot.m_data[1] = local_258.coord.rot.m_data[1];
  local_2e8.coord.rot.m_data[2] = local_258.coord.rot.m_data[2];
  local_2e8.coord.rot.m_data[3] = local_258.coord.rot.m_data[3];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_04,&local_2e8);
  local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_04;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
            (&local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_04);
  peVar7 = local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_258.coord.pos.m_data[1] = this->speed;
  local_258._vptr_ChFrame = (_func_int **)(local_258.coord.pos.m_data[1] * VECT_X);
  local_258.coord.pos.m_data[0] = local_258.coord.pos.m_data[1] * DAT_00b689b8;
  local_258.coord.pos.m_data[1] = local_258.coord.pos.m_data[1] * DAT_00b689c0;
  ChCoordsys<double>::TransformDirectionLocalToParent(mc,(ChVector<double> *)&local_258);
  (**(code **)(*(long *)&(peVar7->super_ChNodeFEAbase).field_0x18 + 0x38))
            (&(peVar7->super_ChNodeFEAbase).field_0x18,&local_2e8);
  peVar7 = local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_2e8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_2e8.coord.pos.m_data[0] = 0.0;
  local_2e8.coord.pos.m_data[1] = 0.0;
  local_2e8.coord.pos.m_data[2] = 0.0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[0] = 1.0;
  local_b8.coord.rot.m_data[1] = 0.0;
  local_b8.coord.rot.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,(ChQuaternion<double> *)&local_2e8);
  ChFrame<double>::operator=(&peVar7->X0,&local_b8);
  this_01 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_338.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_ChNodeFEAbase;
  local_338.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(this_01,&local_338);
  if (local_338.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(local_370,&local_388);
  iVar9 = this->beam_order;
  if (-1 < iVar9) {
    iVar11 = -1;
    do {
      local_2e8._vptr_ChFrame = (_func_int **)0x4059400000000000;
      iVar4._M_current =
           (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->beam_knots,iVar4,(double *)&local_2e8);
        iVar9 = this->beam_order;
      }
      else {
        *iVar4._M_current = 101.0;
        (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar9);
  }
  local_2e8._vptr_ChFrame = (_func_int **)0x4059000000000000;
  iVar4._M_current =
       (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->beam_knots,iVar4,(double *)&local_2e8);
  }
  else {
    *iVar4._M_current = 100.0;
    (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  this_05 = GetLog();
  pCVar10 = ChStreamOutAscii::operator<<(&this_05->super_ChStreamOutAscii,"Create node n.");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(long)(this->beam_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->beam_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10," at x=");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,*(double *)
                                &((local_388.
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_ChNodeFEAbase).field_0x20);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10," x0=");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,((local_388.
                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->X0).coord.pos.m_data[0]);
  ChStreamOutAscii::operator<<(pCVar10,"\n");
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChLinkMotorLinearSpeed,std::allocator<chrono::ChLinkMotorLinearSpeed>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8.coord,
             (ChLinkMotorLinearSpeed **)&local_2e8,
             (allocator<chrono::ChLinkMotorLinearSpeed> *)&local_258);
  local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0];
  pp_Var8 = local_2e8._vptr_ChFrame;
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  local_2e8.coord.pos.m_data[0] = 0.0;
  p_Var2 = (this->actuator).
           super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->actuator).super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pp_Var8;
  (this->actuator).super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0]);
    }
    local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (this->actuator).
            super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->actuator).
       super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar3 = this->mysystem;
  if (local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChSystem::Add(pCVar3,&local_348);
  if (local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar5 = (this->actuator).
           super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_358 = &((local_388.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->super_ChNodeFEAbase).field_0x18;
  if (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (ChNodeFEAxyzrot *)0x0) {
    local_358 = (undefined1 *)0x0;
  }
  local_350 = local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  if (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar6 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_368 = &peVar6->super_ChBodyFrame;
  if (peVar6 == (element_type *)0x0) {
    local_368 = (ChBodyFrame *)0x0;
  }
  local_360 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_360->_M_use_count = local_360->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_360->_M_use_count = local_360->_M_use_count + 1;
    }
  }
  ChFrame<double>::ChFrame(&local_140,mc);
  ChFrame<double>::ChFrame(&local_1c8,mc);
  (**(code **)(*(long *)&(peVar5->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric
                         .super_ChLinkMate.super_ChLink + 0x248))
            (peVar5,&local_358,&local_368,0,&local_140,&local_1c8);
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360);
  }
  if (local_350 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350);
  }
  this_02 = (this->actuator).
            super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  dVar1 = this->speed;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  *(double *)
   &local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = dVar1;
  ChLinkMotorLinearSpeed::SetSpeedFunction(this_02,&local_2f8);
  if (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  *(double *)
   &(((this->actuator).
      super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChLinkMotorLinear).field_0x278 = this->h;
  if (local_388.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

ChExtruderBeamIGA::ChExtruderBeamIGA(ChSystem* msystem,              // system to store the constraints
                                     std::shared_ptr<ChMesh> mmesh,  // mesh to store the resulting elements
                                     std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                     double mh,                                    // element length
                                     const ChCoordsys<> moutlet,  // outlet pos & orientation (x is extrusion direction)
                                     double mspeed,               // speed
                                     int morder                   // element order
) {
    beam_order = morder;
    h = mh;
    outlet = moutlet;
    mysystem = msystem;
    mesh = mmesh;
    beam_section = sect;
    mytime = 0;
    speed = mspeed;

    ground = chrono_types::make_shared<ChBody>();
    ground->SetBodyFixed(true);
    mysystem->Add(ground);

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(outlet));
    nodeA->SetPos_dt(outlet.TransformDirectionLocalToParent(VECT_X * this->speed));
    nodeA->SetX0(ChFrame<>());
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    // p+1 repeated end knots for the start
    for (int i = 0; i < this->beam_order + 1; ++i) {
        beam_knots.push_back(101.);
    }
    beam_knots.push_back(100.);

    GetLog() << "Create node n." << beam_nodes.size() << " at x=" << nodeA->GetPos().x()
             << " x0=" << nodeA->GetX0().GetPos().x() << "\n";

    actuator = chrono_types::make_shared<ChLinkMotorLinearSpeed>();
    mysystem->Add(actuator);
    actuator->Initialize(nodeA, ground, false, ChFrame<>(outlet), ChFrame<>(outlet));
    actuator->SetSpeedFunction(chrono_types::make_shared<ChFunction_Const>(this->speed));
    actuator->SetMotionOffset(this->h);
}